

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O1

exr_result_t
exr_attr_string_vector_copy
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,exr_attr_string_vector_t *src)

{
  exr_result_t eVar1;
  long lVar2;
  long lVar3;
  
  if (src == (exr_attr_string_vector_t *)0x0) {
    eVar1 = 3;
  }
  else {
    eVar1 = exr_attr_string_vector_init(ctxt,sv,src->n_strings);
    if (eVar1 == 0) {
      if (0 < src->n_strings) {
        lVar2 = 0;
        lVar3 = 0;
        do {
          eVar1 = exr_attr_string_set_with_length
                            (ctxt,(exr_attr_string_t *)((long)&sv->strings->length + lVar2),
                             *(char **)((long)&src->strings->str + lVar2),
                             *(int32_t *)((long)&src->strings->length + lVar2));
          if (eVar1 != 0) goto LAB_00112a63;
          lVar3 = lVar3 + 1;
          lVar2 = lVar2 + 0x10;
        } while (lVar3 < src->n_strings);
      }
    }
    else {
LAB_00112a63:
      exr_attr_string_vector_destroy(ctxt,sv);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_vector_copy (
    exr_context_t                   ctxt,
    exr_attr_string_vector_t*       sv,
    const exr_attr_string_vector_t* src)
{
    exr_result_t rv;

    if (!src) return EXR_ERR_INVALID_ARGUMENT;
    rv = exr_attr_string_vector_init (ctxt, sv, src->n_strings);
    for (int i = 0; rv == EXR_ERR_SUCCESS && i < src->n_strings; ++i)
    {
        rv = exr_attr_string_set_with_length (
            ctxt,
            EXR_CONST_CAST (exr_attr_string_t*, sv->strings + i),
            src->strings[i].str,
            src->strings[i].length);
    }
    if (rv != EXR_ERR_SUCCESS) exr_attr_string_vector_destroy (ctxt, sv);
    return rv;
}